

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitStructCmpxchg(OptimizeInstructions *this,StructCmpxchg *curr)

{
  Index IVar1;
  Expression *first;
  Binary *condition;
  Index index;
  bool bVar2;
  bool bVar3;
  BinaryOp op;
  Module *wasm;
  Drop *left;
  Drop *right;
  Block *second;
  Function *pFVar4;
  LocalGet *pLVar5;
  StructGet *pSVar6;
  ExpressionList *pEVar7;
  LocalGet *value;
  StructSet *ifTrue;
  If *item;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> local_140;
  uintptr_t local_130;
  _Head_base<0UL,_wasm::Function_*,_false> local_128;
  uintptr_t local_120;
  Binary *local_118;
  Expression *pred;
  LocalGet *local_108;
  LocalGet *rhs;
  uintptr_t local_f8;
  _Head_base<0UL,_wasm::Function_*,_false> local_f0;
  LocalSet *local_e8;
  LocalSet *lhs;
  optional<wasm::Type> local_d8;
  LocalSet *local_c8;
  LocalSet *local_c0;
  LocalSet *local_b8;
  initializer_list<wasm::Expression_*> local_b0;
  Block *local_a0;
  Block *block;
  Index local_8c;
  Type TStack_88;
  Index result;
  Index local_7c;
  Type TStack_78;
  Index replacement;
  Index local_6c;
  _Head_base<0UL,_wasm::Function_*,_false> _Stack_68;
  Index expected;
  Index local_5c;
  HeapType HStack_58;
  Index ref;
  uintptr_t local_50;
  optional<wasm::Type> local_40;
  Expression *local_30;
  Expression *ref_1;
  Builder local_20;
  Builder builder;
  StructCmpxchg *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm = (Module *)curr;
  skipNonNullCast(this,&curr->ref,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)builder.wasm,(Expression **)&(builder.wasm)->functions);
  if ((!bVar2) &&
     (bVar2 = wasm::Type::isStruct
                        ((Type *)(((builder.wasm)->functions).
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1)), bVar2)) {
    wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
    Builder::Builder(&local_20,wasm);
    ref_1 = (Expression *)
            wasm::Type::getHeapType
                      ((Type *)(((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    bVar3 = HeapType::isShared((HeapType *)&ref_1);
    bVar2 = false;
    if (bVar3) {
      bVar2 = *(int *)&((builder.wasm)->globals).
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 1;
    }
    if (!bVar2) {
      bVar2 = areConsecutiveInputsEqual
                        (this,(Expression *)
                              ((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                         (Expression *)
                         ((builder.wasm)->functions).
                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        first = (Expression *)
                ((builder.wasm)->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        left = Builder::makeDrop(&local_20,
                                 (Expression *)
                                 ((builder.wasm)->functions).
                                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
        right = Builder::makeDrop(&local_20,
                                  (Expression *)
                                  ((builder.wasm)->functions).
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::optional<wasm::Type>::optional(&local_40);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_40.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_40.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        second = Builder::makeSequence(&local_20,(Expression *)left,(Expression *)right,type);
        local_30 = getResultOfFirst(this,first,(Expression *)second);
        local_50 = (uintptr_t)
                   ((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pSVar6 = Builder::makeStructGet
                           (&local_20,
                            *(Index *)&((builder.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_30,
                            *(MemoryOrder *)
                             &((builder.wasm)->globals).
                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(Type)local_50,false);
        replaceCurrent(this,(Expression *)pSVar6);
      }
      else {
        HStack_58 = wasm::Type::getHeapType
                              ((Type *)(((builder.wasm)->functions).
                                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        bVar2 = HeapType::isShared(&stack0xffffffffffffffa8);
        if (!bVar2) {
          pFVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getFunction(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                );
          _Stack_68._M_head_impl =
               *(Function **)
                &((builder.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
          local_5c = Builder::addVar(pFVar4,(Type)_Stack_68._M_head_impl);
          pFVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getFunction(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                );
          TStack_78.id = (uintptr_t)
                         ((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          local_6c = Builder::addVar(pFVar4,TStack_78);
          pFVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getFunction(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                );
          TStack_88.id = (uintptr_t)
                         ((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          local_7c = Builder::addVar(pFVar4,TStack_88);
          pFVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getFunction(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                );
          block = (Block *)((builder.wasm)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
          local_8c = Builder::addVar(pFVar4,(Type)block);
          local_c8 = Builder::makeLocalSet
                               (&local_20,local_5c,
                                (Expression *)
                                ((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          local_c0 = Builder::makeLocalSet
                               (&local_20,local_6c,
                                (Expression *)
                                ((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
          local_b8 = Builder::makeLocalSet
                               (&local_20,local_7c,
                                (Expression *)
                                ((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_b0._M_array = (iterator)&local_c8;
          local_b0._M_len = 3;
          std::optional<wasm::Type>::optional(&local_d8);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_d8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_d8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          local_a0 = Builder::makeBlock(&local_20,&local_b0,type_00);
          index = local_8c;
          IVar1 = *(Index *)&((builder.wasm)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_f0._M_head_impl =
               *(Function **)
                &((builder.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
          pLVar5 = Builder::makeLocalGet(&local_20,local_5c,(Type)local_f0._M_head_impl);
          local_f8 = (uintptr_t)
                     ((builder.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pSVar6 = Builder::makeStructGet
                             (&local_20,IVar1,(Expression *)pLVar5,Unordered,(Type)local_f8,false);
          rhs = (LocalGet *)
                ((builder.wasm)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          local_e8 = Builder::makeLocalTee(&local_20,index,(Expression *)pSVar6,(Type)rhs);
          pred = (Expression *)
                 ((builder.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          local_108 = Builder::makeLocalGet(&local_20,local_6c,(Type)pred);
          local_118 = (Binary *)0x0;
          bVar2 = wasm::Type::isRef((Type *)&((builder.wasm)->exports).
                                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar2) {
            local_118 = (Binary *)
                        Builder::makeRefEq(&local_20,(Expression *)local_e8,(Expression *)local_108)
            ;
          }
          else {
            local_120 = (uintptr_t)
                        ((builder.wasm)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            op = Abstract::getBinary((Type)local_120,Eq);
            local_118 = Builder::makeBinary(&local_20,op,(Expression *)local_e8,
                                            (Expression *)local_108);
          }
          condition = local_118;
          pEVar7 = &local_a0->list;
          IVar1 = *(Index *)&((builder.wasm)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_128._M_head_impl =
               *(Function **)
                &((builder.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
          pLVar5 = Builder::makeLocalGet(&local_20,local_5c,(Type)local_128._M_head_impl);
          local_130 = (uintptr_t)
                      ((builder.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          value = Builder::makeLocalGet(&local_20,local_7c,(Type)local_130);
          ifTrue = Builder::makeStructSet
                             (&local_20,IVar1,(Expression *)pLVar5,(Expression *)value,Unordered);
          std::optional<wasm::Type>::optional(&local_140);
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_140.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_140.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          item = Builder::makeIf(&local_20,(Expression *)condition,(Expression *)ifTrue,
                                 (Expression *)0x0,type_01);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&pEVar7->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)item);
          pEVar7 = &local_a0->list;
          pLVar5 = Builder::makeLocalGet
                             (&local_20,local_8c,
                              (Type)((builder.wasm)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&pEVar7->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pLVar5);
          (local_a0->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
               (uintptr_t)
               ((builder.wasm)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          replaceCurrent(this,(Expression *)local_a0);
        }
      }
    }
  }
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    Builder builder(*getModule());

    // As with other RMW operations, we cannot optimize if the RMW is
    // sequentially consistent and to shared memory.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    // Just like other RMW operations, unshared or release-acquire cmpxchg can
    // be optimized to just a read if it is known not to change the in-memory
    // value. This is the case when `expected` and `replacement` are known to be
    // the same.
    if (areConsecutiveInputsEqual(curr->expected, curr->replacement)) {
      auto* ref = getResultOfFirst(
        curr->ref,
        builder.makeSequence(builder.makeDrop(curr->expected),
                             builder.makeDrop(curr->replacement)));
      replaceCurrent(
        builder.makeStructGet(curr->index, ref, curr->order, curr->type));
      return;
    }

    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Just like other RMW operations, lower to basic operations when operating
    // on unshared memory.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto expected = builder.addVar(getFunction(), curr->type);
    auto replacement = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(ref, curr->ref),
                         builder.makeLocalSet(expected, curr->expected),
                         builder.makeLocalSet(replacement, curr->replacement)});
    auto* lhs = builder.makeLocalTee(
      result,
      builder.makeStructGet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            MemoryOrder::Unordered,
                            curr->type),
      curr->type);
    auto* rhs = builder.makeLocalGet(expected, curr->type);
    Expression* pred = nullptr;
    if (curr->type.isRef()) {
      pred = builder.makeRefEq(lhs, rhs);
    } else {
      pred = builder.makeBinary(
        Abstract::getBinary(curr->type, Abstract::Eq), lhs, rhs);
    }
    block->list.push_back(builder.makeIf(
      pred,
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            builder.makeLocalGet(replacement, curr->type),
                            MemoryOrder::Unordered)));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }